

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O1

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  byte *__s;
  size_t sVar5;
  void *pvVar6;
  ushort **ppuVar7;
  long lVar8;
  byte *pbVar9;
  size_t uznum;
  long lVar10;
  byte bVar11;
  size_t sVar12;
  bool bVar13;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_208;
  int local_200;
  uint local_1fc;
  size_t local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e8 = 0x100;
  *outlen = 0;
  local_1d0 = (FILE *)stream;
  pcVar4 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar4;
  if (pcVar4 == (char *)0x0) {
    return -1;
  }
  local_1fc = -1;
  __s = (byte *)0x0;
  *pcVar4 = '\0';
  local_d8[0] = '\0';
  local_1c8[0] = '\0';
  local_178[0] = '\0';
  local_128[0] = '\0';
  local_88[0] = '\0';
  bVar1 = true;
  sVar12 = 0;
  local_200 = 0;
  local_208 = 0;
  local_1e0 = sub;
  local_1d8 = main;
LAB_00103cca:
  do {
    uznum = sVar12;
    if (__s == (byte *)0x0) {
      __s = (byte *)(*Curl_cmalloc)(0x80);
      uznum = 0x80;
      if (__s != (byte *)0x0) goto LAB_00103cf1;
      uVar3 = 0xffffffff;
    }
    else {
LAB_00103cf1:
      iVar2 = curlx_uztosi(uznum);
      pcVar4 = fgets((char *)__s,iVar2,local_1d0);
      if (pcVar4 != (char *)0x0) {
        sVar5 = strlen((char *)__s);
        lVar8 = 2;
        if ((__s[sVar5 - 1] != 10) && (lVar8 = 3, uznum - 1 <= sVar5)) {
          pvVar6 = (*Curl_crealloc)(__s,uznum * 2);
          if (pvVar6 == (void *)0x0) {
            lVar8 = 1;
          }
          else {
            lVar8 = 0;
          }
        }
        iVar2 = (*(code *)((long)&DAT_001051a8 + (long)(int)(&DAT_001051a8)[lVar8]))();
        return iVar2;
      }
      uVar3 = 1;
      sVar12 = uznum;
    }
    if (uVar3 != 0) goto LAB_001041c1;
    bVar11 = *__s;
    if (bVar11 != 0) {
      ppuVar7 = __ctype_b_loc();
      lVar10 = 2;
      lVar8 = 0;
      do {
        if ((*(byte *)((long)*ppuVar7 + (ulong)bVar11 * 2 + 1) & 0x20) == 0) {
          if (bVar11 == 0x3c) {
            if (__s[lVar10 + -1] == 0x2f) {
              pbVar9 = __s + (2 - lVar8);
              bVar11 = __s[lVar10];
              if (bVar11 == 0) goto LAB_00103e77;
              ppuVar7 = __ctype_b_loc();
              goto LAB_00103e55;
            }
            if (!bVar1) goto LAB_001040c0;
            pbVar9 = __s + (1 - lVar8);
            bVar11 = __s[lVar10 + -1];
            if (bVar11 == 0) goto LAB_00103fac;
            ppuVar7 = __ctype_b_loc();
            goto LAB_00103f8a;
          }
          break;
        }
        bVar11 = __s[lVar10 + -1];
        lVar8 = lVar8 + -1;
        lVar10 = lVar10 + 1;
      } while (bVar11 != 0);
    }
  } while ((bVar1) ||
          (iVar2 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_200), iVar2 == 0));
  uVar3 = 0xffffffff;
  goto LAB_001041c1;
  while( true ) {
    bVar11 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    if (bVar11 == 0) break;
LAB_00103e55:
    if ((bVar11 == 0x3e) || (((*ppuVar7)[bVar11] & 0x2000) != 0)) break;
  }
LAB_00103e77:
  if (0x4f < (long)(pbVar9 + (lVar8 - (long)__s) + -2)) {
    uVar3 = 0xfffffffe;
    goto LAB_001041c1;
  }
  memcpy(local_1c8,__s + lVar10,(size_t)(pbVar9 + (lVar8 - (long)__s) + -2));
  local_1c8[(long)(pbVar9 + ((lVar8 + -2) - (long)__s))] = '\0';
  if (local_208 == 1) {
    iVar2 = strcmp(local_88,local_1c8);
    local_208 = 1;
    if (iVar2 == 0) {
      local_88[0] = '\0';
      local_208 = 0;
      uVar3 = 0;
      if (!bVar1) goto LAB_001041c1;
    }
  }
  else if (local_208 == 2) {
    iVar2 = strcmp(local_128,local_1c8);
    if (iVar2 == 0) {
      local_128[0] = '\0';
      local_208 = 1;
      if (!bVar1) {
        uVar3 = 0;
        if (local_200 == 0) goto LAB_001041c1;
        iVar2 = decodedata(outbuf,outlen);
LAB_00104253:
        uVar3 = 0;
        if (iVar2 != 0) {
          return local_1fc;
        }
        goto LAB_001041c1;
      }
    }
  }
  else if ((local_208 == 3) && (iVar2 = strcmp(local_178,local_1c8), iVar2 == 0)) {
    local_178[0] = '\0';
    local_208 = 2;
    if (!bVar1) {
      uVar3 = 0;
      if (local_200 == 0) goto LAB_001041c1;
      iVar2 = decodedata(outbuf,outlen);
      local_1fc = iVar2;
      goto LAB_00104253;
    }
  }
LAB_001040c0:
  if ((!bVar1) && (uVar3 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_200), uVar3 != 0))
  {
LAB_001041c1:
    (*Curl_cfree)(__s);
    local_1fc = 0;
    if (1 < uVar3) {
      (*Curl_cfree)(*outbuf);
      *outbuf = (char *)0x0;
      *outlen = 0;
      local_1fc = uVar3;
    }
    return local_1fc;
  }
  goto LAB_00103cca;
  while( true ) {
    bVar11 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    if (bVar11 == 0) break;
LAB_00103f8a:
    if ((bVar11 == 0x3e) || (((*ppuVar7)[bVar11] & 0x2000) != 0)) break;
  }
LAB_00103fac:
  uVar3 = 0xfffffffe;
  if (0x4f < (long)(pbVar9 + (lVar8 - (long)__s) + -1)) goto LAB_001041c1;
  memcpy(local_1c8,__s + lVar10 + -1,(size_t)(pbVar9 + (lVar8 - (long)__s) + -1));
  pbVar9[(long)(local_1c8 + ((lVar8 + -1) - (long)__s))] = 0;
  if ((local_1c8[0] == '!') || (local_1c8[0] == '?')) {
    bVar1 = true;
    goto LAB_00103cca;
  }
  bVar11 = *pbVar9;
  if (bVar11 != 0) {
    ppuVar7 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar7 + (ulong)bVar11 * 2 + 1) & 0x20) == 0) break;
      bVar11 = pbVar9[1];
      pbVar9 = pbVar9 + 1;
    } while (bVar11 != 0);
  }
  for (sVar5 = 0; (pbVar9[sVar5] != 0 && (pbVar9[sVar5] != 0x3e)); sVar5 = sVar5 + 1) {
  }
  if (0x4f < (long)sVar5) goto LAB_001041c1;
  memcpy(local_d8,pbVar9,sVar5);
  local_d8[sVar5] = '\0';
  if (local_208 == 2) {
    strcpy(local_178,local_1c8);
    iVar2 = strcmp(local_128,local_1d8);
    local_208 = 3;
    bVar1 = true;
    if ((iVar2 == 0) && (iVar2 = strcmp(local_178,local_1e0), iVar2 == 0)) {
      pcVar4 = strstr(local_d8,"base64=");
      if (pcVar4 != (char *)0x0) {
        local_200 = 1;
      }
      local_208 = 3;
      bVar1 = false;
    }
    goto LAB_00103cca;
  }
  if (local_208 == 1) {
    local_208 = 2;
    pcVar4 = local_128;
  }
  else {
    bVar13 = local_208 != 0;
    local_208 = 3;
    if (bVar13) goto LAB_001040c0;
    local_208 = 1;
    pcVar4 = local_88;
  }
  strcpy(pcVar4,local_1c8);
  bVar1 = true;
  goto LAB_00103cca;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}